

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

ssize_t Curl_xfer_recv_resp(Curl_easy *data,char *buf,size_t blen,_Bool eos_reliable,CURLcode *err)

{
  CURLcode CVar1;
  size_t sVar2;
  curl_off_t totalleft;
  ssize_t nread;
  CURLcode *err_local;
  size_t sStack_28;
  _Bool eos_reliable_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  sStack_28 = blen;
  if (((!eos_reliable) && (sStack_28 = blen, (*(ushort *)&(data->req).field_0xbb & 1) == 0)) &&
     (sStack_28 = blen, (data->req).size != -1)) {
    sVar2 = (data->req).size - (data->req).bytecount;
    if ((long)sVar2 < 1) {
      sStack_28 = 0;
    }
    else {
      sStack_28 = blen;
      if ((long)sVar2 < (long)blen) {
        sStack_28 = sVar2;
      }
    }
  }
  if (sStack_28 == 0) {
    *err = CURLE_OK;
    data_local = (Curl_easy *)0x0;
  }
  else {
    nread = (ssize_t)err;
    err_local._7_1_ = eos_reliable;
    blen_local = (size_t)buf;
    buf_local = (char *)data;
    CVar1 = Curl_read(data,data->conn->sockfd,buf,sStack_28,&totalleft);
    *(CURLcode *)nread = CVar1;
    if (*(int *)nread == 0) {
      *(undefined4 *)nread = 0;
      data_local = (Curl_easy *)totalleft;
    }
    else {
      data_local = (Curl_easy *)0xffffffffffffffff;
    }
  }
  return (ssize_t)data_local;
}

Assistant:

static ssize_t Curl_xfer_recv_resp(struct Curl_easy *data,
                                   char *buf, size_t blen,
                                   bool eos_reliable,
                                   CURLcode *err)
{
  ssize_t nread;

  DEBUGASSERT(blen > 0);
  /* If we are reading BODY data and the connection does NOT handle EOF
   * and we know the size of the BODY data, limit the read amount */
  if(!eos_reliable && !data->req.header && data->req.size != -1) {
    curl_off_t totalleft = data->req.size - data->req.bytecount;
    if(totalleft <= 0)
      blen = 0;
    else if(totalleft < (curl_off_t)blen)
      blen = (size_t)totalleft;
  }

  if(!blen) {
    /* want nothing - continue as if read nothing. */
    DEBUGF(infof(data, "readwrite_data: we're done"));
    *err = CURLE_OK;
    return 0;
  }

  *err = Curl_read(data, data->conn->sockfd, buf, blen, &nread);
  if(*err)
    return -1;
  DEBUGASSERT(nread >= 0);
  *err = CURLE_OK;
  return nread;
}